

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

RK_U32 __thiscall MppBufferService::get_group_id(MppBufferService *this)

{
  MppBufferGroupImpl *pMVar1;
  RK_U32 local_14;
  RK_U32 id;
  MppBufferService *this_local;
  
  local_14 = 0;
  if (get_group_id::overflowed == 0) {
    if (this->group_id == 0) {
      get_group_id::overflowed = 1;
      this->group_id = 1;
    }
    else {
      local_14 = this->group_id;
      this->group_id = local_14 + 1;
    }
  }
  if (get_group_id::overflowed != 0) {
    local_14 = this->group_id;
    this->group_id = local_14 + 1;
    while (pMVar1 = get_group_by_id(this,local_14), pMVar1 != (MppBufferGroupImpl *)0x0) {
      local_14 = this->group_id;
      this->group_id = local_14 + 1;
    }
  }
  this->group_count = this->group_count + 1;
  return local_14;
}

Assistant:

RK_U32 MppBufferService::get_group_id()
{
    RK_U32 id = 0;
    static RK_U32 overflowed = 0;

    if (!overflowed) {
        /* avoid 0 group id */
        if (group_id)
            id = group_id++;
        else {
            overflowed = 1;
            group_id = 1;
        }
    }

    if (overflowed) {
        id = group_id++;

        /* when it is overflow avoid the used id */
        while (get_group_by_id(id))
            id = group_id++;
    }

    group_count++;

    return id;
}